

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O0

float __thiscall Imath_3_2::Vec2<float>::length(Vec2<float> *this)

{
  Vec2<float> *in_RDI;
  float fVar1;
  float fVar2;
  double dVar3;
  float length2;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  fVar1 = dot(in_RDI,in_RDI);
  fVar2 = std::numeric_limits<float>::min();
  if (fVar2 * 2.0 <= fVar1) {
    dVar3 = std::sqrt((double)(ulong)(uint)fVar1);
    fVar1 = SUB84(dVar3,0);
  }
  else {
    fVar1 = lengthTiny((Vec2<float> *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8))
    ;
  }
  return fVar1;
}

Assistant:

IMATH_HOSTDEVICE inline T
Vec2<T>::length () const IMATH_NOEXCEPT
{
    T length2 = dot (*this);

    if (IMATH_UNLIKELY (length2 < T (2) * std::numeric_limits<T>::min ()))
        return lengthTiny ();

    return std::sqrt (length2);
}